

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s.c
# Opt level: O1

void Hacl_Hash_Blake2s_hash_with_key
               (uint8_t *output,uint32_t output_len,uint8_t *input,uint32_t input_len,uint8_t *key,
               uint32_t key_len)

{
  uint64_t prev;
  size_t __n;
  ulong __n_00;
  uint32_t b [16];
  uint32_t b1 [16];
  uint local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint32_t local_b8 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  
  local_b8[0xc] = 0;
  local_b8[0xd] = 0;
  local_b8[0xe] = 0;
  local_b8[0xf] = 0;
  local_b8[8] = 0;
  local_b8[9] = 0;
  local_b8[10] = 0;
  local_b8[0xb] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[6] = 0;
  local_b8[7] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  local_d8 = 0xbb67ae856a09e667;
  uStack_d0 = 0xa54ff53a3c6ef372;
  local_c8 = 0x9b05688c510e527f;
  uStack_c0 = 0x5be0cd191f83d9ab;
  local_f8 = ((key_len & 0xff) << 8 | output_len & 0xff) ^ 0x6b08e667;
  uStack_f4 = 0xbb67ae85;
  uStack_f0 = 0x3c6ef372;
  uStack_ec = 0xa54ff53a;
  local_e8 = 0x9b05688c510e527f;
  uStack_e0 = 0x5be0cd191f83d9ab;
  if (key_len == 0) {
    prev = 0;
  }
  else {
    __n_00 = (ulong)key_len;
    __n = 0;
    if (key_len < 0x40) {
      __n = 0x40 - __n_00;
    }
    memset((void *)((long)&local_78 + __n_00),0,__n);
    memcpy(&local_78,key,__n_00);
    update_block(local_b8,&local_f8,input_len == 0,0x40,(uint8_t *)&local_78);
    Lib_Memzero0_memzero0(&local_78,0x40);
    prev = 0x40;
    if (input_len == 0) goto LAB_001271dd;
  }
  update_blocks(input_len,local_b8,&local_f8,prev,input);
LAB_001271dd:
  local_78 = CONCAT44(uStack_f4,local_f8);
  uStack_70 = CONCAT44(uStack_ec,uStack_f0);
  local_68 = local_e8;
  uStack_60 = uStack_e0;
  memcpy(output,&local_78,(ulong)output_len);
  Lib_Memzero0_memzero0(&local_78,0x20);
  Lib_Memzero0_memzero0(local_b8,0x40);
  Lib_Memzero0_memzero0(&local_f8,0x40);
  return;
}

Assistant:

void
Hacl_Hash_Blake2s_hash_with_key(
  uint8_t *output,
  uint32_t output_len,
  uint8_t *input,
  uint32_t input_len,
  uint8_t *key,
  uint32_t key_len
)
{
  uint32_t b[16U] = { 0U };
  uint32_t b1[16U] = { 0U };
  Hacl_Hash_Blake2s_init(b, key_len, output_len);
  update(b1, b, key_len, key, input_len, input);
  Hacl_Hash_Blake2s_finish(output_len, output, b);
  Lib_Memzero0_memzero(b1, 16U, uint32_t, void *);
  Lib_Memzero0_memzero(b, 16U, uint32_t, void *);
}